

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O1

SquaredEuclideanDistance * __thiscall
CoreML::Specification::SquaredEuclideanDistance::New(SquaredEuclideanDistance *this,Arena *arena)

{
  SquaredEuclideanDistance *this_00;
  
  this_00 = (SquaredEuclideanDistance *)operator_new(0x18);
  SquaredEuclideanDistance(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SquaredEuclideanDistance>(arena,this_00);
  }
  return this_00;
}

Assistant:

SquaredEuclideanDistance* SquaredEuclideanDistance::New(::google::protobuf::Arena* arena) const {
  SquaredEuclideanDistance* n = new SquaredEuclideanDistance;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}